

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::UseProgStagesCase::iterate(UseProgStagesCase *this)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  RenderContext *pRVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  uint uVar7;
  undefined4 extraout_var;
  TestError *pTVar9;
  GLSLVersion glslVersion;
  GLSLVersion extraout_EDX;
  GLSLVersion extraout_EDX_00;
  GLSLVersion glslVersion_00;
  long lVar10;
  GLuint pipeline;
  GLuint progIdF;
  GLuint progIdV;
  GLint linkStatus;
  string fragNoMain;
  string frag;
  string vtx;
  char *shaderSrc [1];
  ProgramSources sources_1;
  ShaderProgram progNoLink;
  ShaderProgram progVF;
  int local_40c;
  deUint32 local_408;
  deUint32 local_404;
  int local_400;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  value_type local_3f8;
  char *local_3d8;
  long local_3d0;
  char local_3c8;
  undefined7 uStack_3c7;
  char *local_3b8;
  undefined8 local_3b0;
  char local_3a8;
  undefined7 uStack_3a7;
  char *local_398;
  value_type local_390;
  value_type local_370;
  undefined1 local_350 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2c0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [176];
  undefined1 local_1d0 [17];
  undefined8 uStack_1bf;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [32];
  deUint32 local_118;
  long lVar8;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  local_3b8 = &local_3a8;
  local_3b0 = 0;
  local_3a8 = '\0';
  local_3d8 = &local_3c8;
  local_3d0 = 0;
  local_3c8 = '\0';
  generateBasicVertexSrc_abi_cxx11_
            ((string *)local_1b0,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)&local_3b8,(string *)local_1b0);
  glslVersion_00 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    glslVersion_00 = extraout_EDX_00;
  }
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)local_1b0,(glcts *)(ulong)this->m_glslVersion,glslVersion_00);
  std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Begin:UseProgStagesCase iterate",0x1f);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar8 + 0x6d8))(1,&local_40c);
  (**(code **)(lVar8 + 0x98))(local_40c);
  local_398 = local_3b8;
  dVar4 = (**(code **)(lVar8 + 0x3f8))(0x8b31,1);
  (**(code **)(lVar8 + 0x1688))(local_40c,1,dVar4);
  (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b31,&local_404);
  (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b30,&local_408);
  if (((dVar4 == 0) || (local_404 != dVar4)) || (local_408 != 0)) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x2cd);
  }
  else {
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"UseProgramStages failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                    ,0x2cf);
    local_398 = local_3d8;
    dVar5 = (**(code **)(lVar8 + 0x3f8))(0x8b30,1);
    (**(code **)(lVar8 + 0x1688))(local_40c,2,dVar5);
    (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b30,&local_408);
    if (((dVar5 == 0) || (local_408 != dVar5)) || (local_408 == local_404)) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"UseProgramStages failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x2d9);
    }
    else {
      (**(code **)(lVar8 + 0x1688))(local_40c,3,0);
      (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b31,&local_404);
      (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b30,&local_408);
      if (local_408 == 0 && local_404 == 0) {
        pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_350,local_3b8,(allocator<char> *)&local_370);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f8,local_3d8,(allocator<char> *)&local_390);
        memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_280,0,0xac);
        local_1d0._0_8_ = (pointer)0x0;
        local_1d0[8] = '\0';
        local_1d0._9_7_ = 0;
        local_1d0[0x10] = false;
        uStack_1bf = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_280,(value_type *)local_350);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_280 + 0x18),&local_3f8);
        glu::ShaderProgram::ShaderProgram
                  ((ShaderProgram *)local_1b0,pRVar2,(ProgramSources *)local_280);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                (local_280 + 0x90));
        lVar10 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_280 + lVar10));
          lVar10 = lVar10 + -0x18;
        } while (lVar10 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
          operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
        }
        (**(code **)(lVar8 + 0x1058))(local_118,0x8258,1);
        (**(code **)(lVar8 + 0xce8))(local_118);
        (**(code **)(lVar8 + 0x9d8))(local_118,0x8b82,&local_400);
        if (local_400 == 1) {
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"UseProgramStages failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0x2f0);
          (**(code **)(lVar8 + 0x1688))(local_40c,3,local_118);
          (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b31,&local_404);
          (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b30,&local_408);
          if ((local_404 == local_118) && (local_404 == local_408)) {
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"UseProgramStages failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                            ,0x2f9);
            (**(code **)(lVar8 + 0x1688))(local_40c,3,0);
            (**(code **)(lVar8 + 0x1688))(local_40c,1,dVar5);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"UseProgramStages failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                            ,0x2fe);
            (**(code **)(lVar8 + 0x98))(0);
            (**(code **)(lVar8 + 0x450))(1,&local_40c);
            local_40c = 0;
            (**(code **)(lVar8 + 0x6d8))(1);
            (**(code **)(lVar8 + 0x1688))(local_40c,1,dVar4);
            (**(code **)(lVar8 + 0x1688))(local_40c,2,dVar5);
            (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b31,&local_404);
            (**(code **)(lVar8 + 0x9a0))(local_40c,0x8b30,&local_408);
            if ((local_404 == dVar4) && (local_408 == dVar5)) {
              dVar6 = (**(code **)(lVar8 + 0x800))();
              glu::checkError(dVar6,"UseProgramStages failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                              ,0x30d);
              (**(code **)(lVar8 + 0x1688))(local_40c,0xfffffffc,dVar4);
              iVar3 = (**(code **)(lVar8 + 0x800))();
              if (iVar3 == 0x501) {
                (**(code **)(lVar8 + 0x1058))(local_118,0x8258,0);
                (**(code **)(lVar8 + 0xce8))(local_118);
                (**(code **)(lVar8 + 0x9d8))(local_118,0x8b82,&local_400);
                if (local_400 == 1) {
                  dVar6 = (**(code **)(lVar8 + 0x800))();
                  glu::checkError(dVar6,"UseProgramStages failed",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                  ,0x321);
                  (**(code **)(lVar8 + 0x1688))(local_40c,3,local_118);
                  iVar3 = (**(code **)(lVar8 + 0x800))();
                  if (iVar3 == 0x502) {
                    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_3f8,local_3d8,local_3d8 + local_3d0);
                    uVar7 = std::__cxx11::string::find((char *)&local_3f8,0x1af0218,0);
                    std::__cxx11::string::replace
                              ((ulong)&local_3f8,(ulong)uVar7,&DAT_00000004,0x1af021d);
                    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_370,local_3b8,&local_3f9);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_390,local_3f8._M_dataplus._M_p,&local_3fa);
                    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_350,0,0xac);
                    local_2a0._0_8_ = (pointer)0x0;
                    local_2a0[8] = 0;
                    local_2a0._9_7_ = 0;
                    local_2a0[0x10] = 0;
                    local_2a0._17_8_ = 0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_350,&local_370);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(local_338,&local_390);
                    glu::ShaderProgram::ShaderProgram
                              ((ShaderProgram *)local_280,pRVar2,(ProgramSources *)local_350);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2a0);
                    std::
                    vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                    ::~vector(&local_2c0);
                    lVar10 = 0x78;
                    do {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(local_350 + lVar10));
                      lVar10 = lVar10 + -0x18;
                    } while (lVar10 != -0x18);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_390._M_dataplus._M_p != &local_390.field_2) {
                      operator_delete(local_390._M_dataplus._M_p,
                                      local_390.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_370._M_dataplus._M_p != &local_370.field_2) {
                      operator_delete(local_370._M_dataplus._M_p,
                                      local_370.field_2._M_allocated_capacity + 1);
                    }
                    (**(code **)(lVar8 + 0x1058))(local_280._152_4_,0x8258,1);
                    (**(code **)(lVar8 + 0xce8))(local_280._152_4_);
                    (**(code **)(lVar8 + 0x1688))(local_40c,3,local_280._152_4_);
                    iVar3 = (**(code **)(lVar8 + 0x800))();
                    if (iVar3 == 0x502) {
                      (**(code **)(lVar8 + 0x1688))(local_40c + 1000,1,dVar4);
                      iVar3 = (**(code **)(lVar8 + 0x800))();
                      if (iVar3 == 0x502) {
                        (**(code **)(lVar8 + 0x450))(1,&local_40c);
                        (**(code **)(lVar8 + 0x1688))(local_40c,1,dVar4);
                        iVar3 = (**(code **)(lVar8 + 0x800))();
                        if (iVar3 == 0x502) {
                          (**(code **)(lVar8 + 0x448))(dVar4);
                          (**(code **)(lVar8 + 0x448))(dVar5);
                          tcu::TestContext::setTestResult
                                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                                     QP_TEST_RESULT_PASS,"Pass");
                          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_280);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                            operator_delete(local_3f8._M_dataplus._M_p,
                                            local_3f8.field_2._M_allocated_capacity + 1);
                          }
                          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1b0);
                          if (local_3d8 != &local_3c8) {
                            operator_delete(local_3d8,CONCAT71(uStack_3c7,local_3c8) + 1);
                          }
                          if (local_3b8 != &local_3a8) {
                            operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
                          }
                          return STOP;
                        }
                        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (pTVar9,"UseProgramStages failed",(char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                   ,0x348);
                      }
                      else {
                        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (pTVar9,"UseProgramStages failed",(char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                   ,0x33f);
                      }
                    }
                    else {
                      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar9,"UseProgramStages failed",(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x337);
                    }
                    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar9,"UseProgramStages failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x326);
                }
                else {
                  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar9,"UseProgramStages failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,799);
                }
              }
              else {
                pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar9,"UseProgramStages failed",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                           ,0x316);
              }
            }
            else {
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,"UseProgramStages failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x30b);
            }
          }
          else {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"UseProgramStages failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x2f7);
          }
        }
        else {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"UseProgramStages failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0x2ee);
        }
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"UseProgramStages failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x2e2);
    }
  }
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		glw::GLenum			  err;
		glw::GLuint			  pipeline;
		glw::GLuint			  progIdV, progIdF;
		glw::GLuint			  programVtx, programFrag;
		const char*			  shaderSrc[1];
		std::string			  vtx;
		std::string			  frag;
		glw::GLint			  linkStatus;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// UseProgramStages verification
		log << TestLog::Message << "Begin:UseProgStagesCase iterate" << TestLog::EndMessage;

		gl.genProgramPipelines(1, &pipeline);
		gl.bindProgramPipeline(pipeline);

		// Use Vertex Shader
		shaderSrc[0] = vtx.c_str();
		programVtx   = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, shaderSrc);

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((programVtx == 0) || (progIdV != programVtx) || (progIdF != 0))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Use Fragment Shader
		shaderSrc[0] = frag.c_str();
		programFrag  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);

		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programFrag);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((programFrag == 0) || (progIdF != programFrag) || (progIdF == progIdV))
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Reset stages
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, 0);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != 0) || (progIdF != 0))
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// One program for both.
		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		// Make separable and relink
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != progVF.getProgram()) || (progIdV != progIdF))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Use a fragment program with vertex bit
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programFrag);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Unbound pipeline
		gl.bindProgramPipeline(0);
		gl.deleteProgramPipelines(1, &pipeline);
		pipeline = 0;
		gl.genProgramPipelines(1, &pipeline);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programFrag);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != programVtx) || (progIdF != programFrag))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Negative Cases

		// Invalid stages
		gl.useProgramStages(pipeline, GL_ALL_SHADER_BITS ^ (GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT), programVtx);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Program that is not separable
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Program that is not successfully linked
		// remove the main keyword
		std::string  fragNoMain = frag;
		unsigned int pos		= (unsigned int)fragNoMain.find("main");
		fragNoMain.replace(pos, 4, "niaM");
		glu::ShaderProgram progNoLink(m_context.getRenderContext(),
									  glu::makeVtxFragSources(vtx.c_str(), fragNoMain.c_str()));

		gl.programParameteri(progNoLink.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progNoLink.getProgram());
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progNoLink.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Invalid pipeline
		gl.useProgramStages(pipeline + 1000, GL_VERTEX_SHADER_BIT, programVtx);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Invalid pipeline
		gl.deleteProgramPipelines(1, &pipeline);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		gl.deleteProgram(programVtx);
		gl.deleteProgram(programFrag);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}